

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O1

void duckdb::BitpackingCompressionState<unsigned_char,_true,_signed_char>::BitpackingWriter::
     WriteConstant(uchar constant,idx_t count,void *data_ptr,bool all_invalid)

{
  int iVar1;
  int iVar2;
  long lVar3;
  bitpacking_metadata_encoded_t encoded_value;
  
  FlushAndCreateSegmentIfFull
            ((BitpackingCompressionState<unsigned_char,_true,_signed_char> *)data_ptr,1,4);
  iVar1 = *(int *)((long)data_ptr + 0x40);
  optional_ptr<duckdb::FileBuffer,_true>::CheckValid
            ((optional_ptr<duckdb::FileBuffer,_true> *)((long)data_ptr + 0x38));
  lVar3 = *(long *)((long)data_ptr + 0x48);
  iVar2 = *(int *)(*(long *)((long)data_ptr + 0x38) + 0x10);
  *(long *)((long)data_ptr + 0x48) = lVar3 + -4;
  *(uint *)(lVar3 + -4) = iVar1 - iVar2 | 0x2000000;
  **(uchar **)((long)data_ptr + 0x40) = constant;
  *(long *)((long)data_ptr + 0x40) = *(long *)((long)data_ptr + 0x40) + 1;
  UpdateStats((BitpackingCompressionState<unsigned_char,_true,_signed_char> *)data_ptr,count);
  return;
}

Assistant:

static void WriteConstant(T constant, idx_t count, void *data_ptr, bool all_invalid) {
			auto state = reinterpret_cast<BitpackingCompressionState<T, WRITE_STATISTICS> *>(data_ptr);

			ReserveSpace(state, sizeof(T));
			WriteMetaData(state, BitpackingMode::CONSTANT);
			WriteData(state->data_ptr, constant);

			UpdateStats(state, count);
		}